

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::JunitReporter::writeGroup(JunitReporter *this,TestGroupNode *groupNode,double suiteTime)

{
  bool bVar1;
  int iVar2;
  TestCaseNode *testCaseNode;
  IConfig *pIVar3;
  XmlWriter *this_00;
  reference this_01;
  ScopedElement *this_02;
  ScopedElement *this_03;
  long in_RSI;
  long in_RDI;
  const_iterator itEnd;
  const_iterator it;
  TestGroupStats *stats;
  ScopedElement e;
  vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  *in_stack_fffffffffffffc88;
  __normal_iterator<const_Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
  *in_stack_fffffffffffffc90;
  string *in_stack_fffffffffffffc98;
  allocator *paVar4;
  Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode> *in_stack_fffffffffffffcb0;
  XmlWriter *in_stack_fffffffffffffcb8;
  string *in_stack_fffffffffffffcc8;
  string *in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  XmlWriter *in_stack_fffffffffffffcf0;
  JunitReporter *this_04;
  string local_2a0 [32];
  string local_280 [39];
  allocator local_259;
  string local_258 [40];
  string local_230 [32];
  string local_210 [39];
  allocator local_1e9;
  string local_1e8 [40];
  Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
  *local_1c0;
  __normal_iterator<const_Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
  local_1b8;
  char (*in_stack_fffffffffffffe50) [4];
  string *in_stack_fffffffffffffe58;
  XmlWriter *in_stack_fffffffffffffe60;
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  undefined1 local_131 [33];
  size_t local_110;
  allocator local_101;
  string local_100 [32];
  long local_e0;
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [32];
  long local_60;
  allocator local_41;
  string local_40 [48];
  long local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"testsuite",&local_41);
  XmlWriter::scopedElement(in_stack_fffffffffffffcb8,(string *)in_stack_fffffffffffffcb0);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_60 = local_10 + 0x10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"name",&local_81);
  XmlWriter::writeAttribute
            (in_stack_fffffffffffffcf0,
             (string *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
             in_stack_fffffffffffffce0);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"errors",&local_a9);
  XmlWriter::writeAttribute<unsigned_int>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,(uint *)in_stack_fffffffffffffe50);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"failures",&local_d1);
  local_e0 = *(long *)(local_60 + 0x40) - (ulong)*(uint *)(in_RDI + 0x408);
  XmlWriter::writeAttribute<unsigned_long>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             (unsigned_long *)in_stack_fffffffffffffe50);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"tests",&local_101);
  local_110 = Counts::total((Counts *)(local_60 + 0x38));
  XmlWriter::writeAttribute<unsigned_long>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             (unsigned_long *)in_stack_fffffffffffffe50);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  testCaseNode = (TestCaseNode *)(in_RDI + 200);
  this_04 = (JunitReporter *)local_131;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_131 + 1),"hostname",(allocator *)this_04);
  XmlWriter::writeAttribute<char[4]>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  std::__cxx11::string::~string((string *)(local_131 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_131);
  pIVar3 = Ptr<const_Catch::IConfig>::operator->((Ptr<const_Catch::IConfig> *)(in_RDI + 0x10));
  iVar2 = (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])();
  if (iVar2 == 2) {
    paVar4 = &local_159;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_158,"time",paVar4);
    XmlWriter::writeAttribute<char[1]>
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               (char (*) [1])in_stack_fffffffffffffe50);
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
  }
  else {
    in_stack_fffffffffffffcc8 = (string *)(in_RDI + 200);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_180,"time",&local_181);
    XmlWriter::writeAttribute<double>
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               (double *)in_stack_fffffffffffffe50);
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
  }
  this_00 = (XmlWriter *)(in_RDI + 200);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffe58,"timestamp",(allocator *)&stack0xfffffffffffffe57);
  XmlWriter::writeAttribute<char[4]>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe58);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe57);
  local_1b8._M_current =
       (Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
        *)std::
          vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
          ::begin(in_stack_fffffffffffffc88);
  local_1c0 = (Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
               *)std::
                 vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
                 ::end(in_stack_fffffffffffffc88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffc90,
                       (__normal_iterator<const_Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
                        *)in_stack_fffffffffffffc88);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<const_Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
              ::operator*(&local_1b8);
    in_stack_fffffffffffffcb0 =
         Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
         ::operator*(this_01);
    writeTestCase(this_04,testCaseNode);
    __gnu_cxx::
    __normal_iterator<const_Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
    ::operator++(&local_1b8);
  }
  this_02 = (ScopedElement *)(in_RDI + 200);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,"system-out",&local_1e9);
  XmlWriter::scopedElement(this_00,(string *)in_stack_fffffffffffffcb0);
  std::__cxx11::ostringstream::str();
  trim(in_stack_fffffffffffffcc8);
  XmlWriter::ScopedElement::writeText
            (this_02,in_stack_fffffffffffffc98,SUB81((ulong)in_stack_fffffffffffffc90 >> 0x38,0));
  std::__cxx11::string::~string(local_210);
  std::__cxx11::string::~string(local_230);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffc90);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  this_03 = (ScopedElement *)(in_RDI + 200);
  paVar4 = &local_259;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"system-err",paVar4);
  XmlWriter::scopedElement(this_00,(string *)in_stack_fffffffffffffcb0);
  std::__cxx11::ostringstream::str();
  trim(in_stack_fffffffffffffcc8);
  XmlWriter::ScopedElement::writeText(this_02,(string *)paVar4,SUB81((ulong)this_03 >> 0x38,0));
  std::__cxx11::string::~string(local_280);
  std::__cxx11::string::~string(local_2a0);
  XmlWriter::ScopedElement::~ScopedElement(this_03);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  XmlWriter::ScopedElement::~ScopedElement(this_03);
  return;
}

Assistant:

void writeGroup( TestGroupNode const& groupNode, double suiteTime ) {
            XmlWriter::ScopedElement e = xml.scopedElement( "testsuite" );
            TestGroupStats const& stats = groupNode.value;
            xml.writeAttribute( "name", stats.groupInfo.name );
            xml.writeAttribute( "errors", unexpectedExceptions );
            xml.writeAttribute( "failures", stats.totals.assertions.failed-unexpectedExceptions );
            xml.writeAttribute( "tests", stats.totals.assertions.total() );
            xml.writeAttribute( "hostname", "tbd" ); // !TBD
            if( m_config->showDurations() == ShowDurations::Never )
                xml.writeAttribute( "time", "" );
            else
                xml.writeAttribute( "time", suiteTime );
            xml.writeAttribute( "timestamp", "tbd" ); // !TBD

            // Write test cases
            for( TestGroupNode::ChildNodes::const_iterator
                    it = groupNode.children.begin(), itEnd = groupNode.children.end();
                    it != itEnd;
                    ++it )
                writeTestCase( **it );

            xml.scopedElement( "system-out" ).writeText( trim( stdOutForSuite.str() ), false );
            xml.scopedElement( "system-err" ).writeText( trim( stdErrForSuite.str() ), false );
        }